

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,int width,int height,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  V2f header;
  Header *this_00;
  Chromaticities *pCVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  Header newHeader;
  undefined8 in_stack_ffffffffffffff60;
  Compression compression_00;
  V2f *value;
  Chromaticities *in_stack_ffffffffffffff88;
  Header *in_stack_ffffffffffffff90;
  Compression in_stack_ffffffffffffff9c;
  LineOrder in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  RgbaChannels in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Header *in_stack_ffffffffffffffc0;
  
  compression_00 = (Compression)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  *in_RDI = &PTR__AcesOutputFile_002abba8;
  value = (V2f *)(in_RDI + 1);
  header = (V2f)operator_new(8);
  Data::Data((Data *)header);
  *value = header;
  anon_unknown_14::checkCompression(compression_00);
  Header::Header(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb4,
                 (V2f *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  this_00 = (Header *)acesChromaticities();
  addChromaticities(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pCVar1 = acesChromaticities();
  addAdoptedNeutral((Header *)header,value);
  pvVar2 = operator_new(0x18);
  std::__cxx11::string::c_str();
  RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)in_stack_ffffffffffffffc0,
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (Header *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  *(void **)in_RDI[1] = pvVar2;
  RgbaOutputFile::setYCRounding
            ((RgbaOutputFile *)this_00,(uint)((ulong)pCVar1 >> 0x20),(uint)pCVar1);
  Header::~Header(this_00);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile (
    const std::string&         name,
    int                        width,
    int                        height,
    RgbaChannels               rgbaChannels,
    float                      pixelAspectRatio,
    const IMATH_NAMESPACE::V2f screenWindowCenter,
    float                      screenWindowWidth,
    LineOrder                  lineOrder,
    Compression                compression,
    int                        numThreads)
    : _data (new Data)
{
    checkCompression (compression);

    Header newHeader (
        width,
        height,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    addChromaticities (newHeader, acesChromaticities ());
    addAdoptedNeutral (newHeader, acesChromaticities ().white);

    _data->rgbaFile =
        new RgbaOutputFile (name.c_str (), newHeader, rgbaChannels, numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}